

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uni_event_list.c
# Opt level: O2

int EventListAdd(EventListHandle handle,void *event,int priority)

{
  undefined8 *puVar1;
  int iVar2;
  long *plVar3;
  int iVar4;
  list_head *new_;
  
  plVar3 = (long *)malloc(0x20);
  if (plVar3 == (long *)0x0) {
    iVar2 = LogLevelValid(0);
    iVar4 = -1;
    if (iVar2 != 0) {
      LogWrite(0,"event_list","EventListAdd",0xea,"alloc memory failed");
    }
  }
  else {
    *(int *)(plVar3 + 2) = priority;
    plVar3[3] = (long)event;
    uni_mutex_lock((long)handle + 0x60);
    if (priority == 4) {
      puVar1 = *(undefined8 **)((long)handle + 0x28);
      *(long **)((long)handle + 0x28) = plVar3;
      *plVar3 = (long)handle + 0x20;
      plVar3[1] = (long)puVar1;
      *puVar1 = plVar3;
      *(int *)((long)handle + 0x38) = *(int *)((long)handle + 0x38) + 1;
    }
    else if (priority == 2) {
      puVar1 = *(undefined8 **)((long)handle + 0x18);
      *(long **)((long)handle + 0x18) = plVar3;
      *plVar3 = (long)handle + 0x10;
      plVar3[1] = (long)puVar1;
      *puVar1 = plVar3;
      *(int *)((long)handle + 0x34) = *(int *)((long)handle + 0x34) + 1;
    }
    else if (priority == 1) {
      puVar1 = *(undefined8 **)((long)handle + 8);
      *(long **)((long)handle + 8) = plVar3;
      *plVar3 = (long)handle;
      plVar3[1] = (long)puVar1;
      *puVar1 = plVar3;
      *(int *)((long)handle + 0x30) = *(int *)((long)handle + 0x30) + 1;
    }
    uni_mutex_unlock((long)handle + 0x60);
    uni_sem_signal((long)handle + 0x68);
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int EventListAdd(EventListHandle handle, void *event, int priority) {
  EventListItem *item = NULL;
  EventList *event_list = (EventList *)handle;
  if (NULL == (item = (EventListItem *)uni_malloc(sizeof(EventListItem)))) {
    LOGE(TAG, "alloc memory failed");
    return -1;
  }

  item->priority = priority;
  item->event    = event;
  uni_mutex_lock(&event_list->mutex);
  if (EVENT_LIST_PRIORITY_HIGHEST == priority) {
    list_add_tail(&item->link, &event_list->highest_list);
    event_list->highest_cnt++;
  } else if (EVENT_LIST_PRIORITY_MEDIUM == priority) {
    list_add_tail(&item->link, &event_list->medium_list);
    event_list->medium_cnt++;
  } else if (EVENT_LIST_PRIORITY_LOWEST == priority) {
    list_add_tail(&item->link, &event_list->lowest_list);
    event_list->lowest_cnt++;
  }
  uni_mutex_unlock(&event_list->mutex);
  uni_sem_signal(&event_list->sem_new_event);
  return 0;
}